

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O1

bool EV_DoElevator(line_t_conflict *line,EElevator elevtype,double speed,double height,int tag)

{
  DSectorEffect *pDVar1;
  sector_t_conflict *psVar2;
  bool bVar3;
  uint uVar4;
  DElevator *this;
  bool bVar5;
  sector_t_conflict *this_00;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  vertex_t *spot;
  vertex_t *local_58;
  FSectorTagIterator local_50;
  double local_48;
  ulong local_40;
  double local_38;
  
  if (line == (line_t_conflict *)0x0 && elevtype == elevateCurrent) {
    bVar5 = false;
  }
  else {
    if (tag == 0) {
      local_50.searchtag = -0x80000000;
      local_50.start = -1;
      if ((line != (line_t_conflict *)0x0) && (line->backsector != (sector_t_conflict *)0x0)) {
        local_50.start = (int)((ulong)((long)line->backsector - (long)sectors) >> 3) * 0x7a44c6b;
      }
    }
    else {
      local_50.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
      local_50.searchtag = tag;
    }
    local_48 = height;
    local_38 = speed;
    uVar4 = FSectorTagIterator::Next(&local_50);
    bVar5 = false;
    if (-1 < (int)uVar4) {
      local_40 = (ulong)elevtype;
      bVar5 = false;
      do {
        this_00 = sectors + uVar4;
        bVar3 = sector_t::PlaneMoving(this_00,0);
        if (bVar3) {
LAB_003f773c:
          uVar4 = FSectorTagIterator::Next(&local_50);
          goto LAB_003f7744;
        }
        pDVar1 = (this_00->ceilingdata).field_0.p;
        if (pDVar1 != (DSectorEffect *)0x0) {
          if (((pDVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_003f773c;
          (this_00->ceilingdata).field_0.p = (DSectorEffect *)0x0;
        }
        this = (DElevator *)
               M_Malloc_Dbg(0x78,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                            ,0x1f9);
        DElevator::DElevator(this,this_00);
        this->m_Type = elevtype;
        this->m_Speed = local_38;
        StartFloorSound((this->super_DMover).super_DSectorEffect.m_Sector);
        if (elevateLower < elevtype) goto LAB_003f7ac5;
        dVar9 = (this_00->floorplane).normal.X;
        dVar6 = (this_00->ceilingplane).normal.X;
        dVar7 = (this_00->centerspot).X;
        dVar10 = dVar9 * dVar7;
        dVar8 = (this_00->centerspot).Y;
        dVar11 = ((this_00->floorplane).normal.Y * dVar8 + (this_00->floorplane).D + dVar10) *
                 (this_00->floorplane).negiC;
        dVar7 = dVar7 * dVar6;
        dVar8 = (dVar8 * (this_00->ceilingplane).normal.Y + (this_00->ceilingplane).D + dVar7) *
                (this_00->ceilingplane).negiC;
        switch((long)&switchD_003f7829::switchdataD_00600a98 +
               (long)(int)(&switchD_003f7829::switchdataD_00600a98)[local_40]) {
        case 0x3f782b:
          this->m_Direction = 1;
          dVar9 = sector_t::FindNextHighestFloor((sector_t *)this_00,&local_58);
          break;
        case 0x3f7842:
          this->m_Direction = -1;
          dVar9 = (this_00->centerspot).Y;
          this->m_FloorDestDist =
               -((dVar11 - local_48) * (this_00->floorplane).normal.Z +
                dVar10 + (this_00->floorplane).normal.Y * dVar9);
          dVar8 = dVar8 - local_48;
LAB_003f79d6:
          this->m_CeilingDestDist =
               -(dVar8 * (this_00->ceilingplane).normal.Z +
                dVar7 + dVar9 * (this_00->ceilingplane).normal.Y);
          goto LAB_003f7ac5;
        case 0x3f7894:
          psVar2 = line->frontsector;
          dVar7 = (line->v1->p).X;
          dVar8 = (line->v1->p).Y;
          dVar10 = ((psVar2->floorplane).normal.Y * dVar8 +
                   (psVar2->floorplane).normal.X * dVar7 + (psVar2->floorplane).D) *
                   (psVar2->floorplane).negiC;
          dVar9 = dVar9 * dVar7;
          dVar12 = (this_00->floorplane).normal.Y * dVar8;
          dVar11 = -((this_00->floorplane).normal.Z * dVar10 + dVar9 + dVar12);
          this->m_FloorDestDist = dVar11;
          dVar6 = dVar6 * dVar7;
          dVar8 = dVar8 * (this_00->ceilingplane).normal.Y;
          dVar7 = (this_00->floorplane).D;
          this->m_CeilingDestDist =
               -(((((this_00->ceilingplane).D + dVar6 + dVar8) * (this_00->ceilingplane).negiC -
                  (dVar9 + dVar7 + dVar12) * (this_00->floorplane).negiC) + dVar10) *
                 (this_00->ceilingplane).normal.Z + dVar8 + dVar6);
          this->m_Direction = (uint)(dVar11 <= dVar7) * 2 + -1;
          goto LAB_003f7ac5;
        case 0x3f7989:
          this->m_Direction = 1;
          dVar9 = (this_00->centerspot).Y;
          this->m_FloorDestDist =
               -((dVar11 + local_48) * (this_00->floorplane).normal.Z +
                dVar10 + (this_00->floorplane).normal.Y * dVar9);
          dVar8 = dVar8 + local_48;
          goto LAB_003f79d6;
        case 0x3f79fe:
          this->m_Direction = -1;
          dVar9 = sector_t::FindNextLowestFloor((sector_t *)this_00,&local_58);
        }
        dVar6 = (local_58->p).X;
        dVar7 = (local_58->p).Y;
        dVar8 = (this_00->floorplane).normal.X * dVar6;
        dVar10 = (this_00->floorplane).normal.Y * dVar7;
        this->m_FloorDestDist = -((this_00->floorplane).normal.Z * dVar9 + dVar8 + dVar10);
        dVar6 = dVar6 * (this_00->ceilingplane).normal.X;
        dVar7 = dVar7 * (this_00->ceilingplane).normal.Y;
        this->m_CeilingDestDist =
             -(((((this_00->ceilingplane).D + dVar6 + dVar7) * (this_00->ceilingplane).negiC -
                (dVar8 + (this_00->floorplane).D + dVar10) * (this_00->floorplane).negiC) + dVar9) *
               (this_00->ceilingplane).normal.Z + dVar7 + dVar6);
LAB_003f7ac5:
        uVar4 = FSectorTagIterator::Next(&local_50);
        bVar5 = true;
LAB_003f7744:
      } while (-1 < (int)uVar4);
    }
  }
  return bVar5;
}

Assistant:

bool EV_DoElevator (line_t *line, DElevator::EElevator elevtype,
					double speed, double height, int tag)
{
	int			secnum;
	bool		rtn;
	sector_t*	sec;
	DElevator*	elevator;
	double		floorheight, ceilingheight;
	double		newheight;
	vertex_t*	spot;

	if (!line && (elevtype == DElevator::elevateCurrent))
		return false;

	secnum = -1;
	rtn = false;

	FSectorTagIterator itr(tag, line);

	// act on all sectors with the same tag as the triggering linedef
	while ((secnum = itr.Next()) >= 0)
	{
		sec = &sectors[secnum];
		// If either floor or ceiling is already activated, skip it
		if (sec->PlaneMoving(sector_t::floor) || sec->ceilingdata) //jff 2/22/98
			continue; // the loop used to break at the end if tag were 0, but would miss that step if "continue" occured [FDARI]

		// create and initialize new elevator thinker
		rtn = true;
		elevator = new DElevator (sec);
		elevator->m_Type = elevtype;
		elevator->m_Speed = speed;
		elevator->StartFloorSound ();

		floorheight = sec->CenterFloor ();
		ceilingheight = sec->CenterCeiling ();

		// set up the fields according to the type of elevator action
		switch (elevtype)
		{
		// elevator down to next floor
		case DElevator::elevateDown:
			elevator->m_Direction = -1;
			newheight = sec->FindNextLowestFloor (&spot);
			elevator->m_FloorDestDist = sec->floorplane.PointToDist (spot, newheight);
			newheight += sec->ceilingplane.ZatPoint(spot) - sec->floorplane.ZatPoint(spot);
			elevator->m_CeilingDestDist = sec->ceilingplane.PointToDist (spot, newheight);
			break;

		// elevator up to next floor
		case DElevator::elevateUp:
			elevator->m_Direction = 1;
			newheight = sec->FindNextHighestFloor (&spot);
			elevator->m_FloorDestDist = sec->floorplane.PointToDist (spot, newheight);
			newheight += sec->ceilingplane.ZatPoint(spot) - sec->floorplane.ZatPoint(spot);
			elevator->m_CeilingDestDist = sec->ceilingplane.PointToDist (spot, newheight);
			break;

		// elevator to floor height of activating switch's front sector
		case DElevator::elevateCurrent:
			newheight = line->frontsector->floorplane.ZatPoint (line->v1);
			elevator->m_FloorDestDist = sec->floorplane.PointToDist (line->v1, newheight);
			newheight += sec->ceilingplane.ZatPoint(line->v1) - sec->floorplane.ZatPoint(line->v1);
			elevator->m_CeilingDestDist = sec->ceilingplane.PointToDist (line->v1, newheight);

			elevator->m_Direction =
				elevator->m_FloorDestDist > sec->floorplane.fD() ? -1 : 1;
			break;

		// [RH] elevate up by a specific amount
		case DElevator::elevateRaise:
			elevator->m_Direction = 1;
			elevator->m_FloorDestDist = sec->floorplane.PointToDist (sec->centerspot, floorheight + height);
			elevator->m_CeilingDestDist = sec->ceilingplane.PointToDist (sec->centerspot, ceilingheight + height);
			break;

		// [RH] elevate down by a specific amount
		case DElevator::elevateLower:
			elevator->m_Direction = -1;
			elevator->m_FloorDestDist = sec->floorplane.PointToDist (sec->centerspot, floorheight - height);
			elevator->m_CeilingDestDist = sec->ceilingplane.PointToDist (sec->centerspot, ceilingheight - height);
			break;
		}
	}
	return rtn;
}